

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall google::protobuf::internal::LazyString::Init_abi_cxx11_(LazyString *this)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_29;
  char *pcStack_28;
  InitValue init_value;
  string *res;
  LazyString *this_local;
  
  WrappedMutex::Lock(&Init::mu);
  init_value.size =
       (size_t)std::
               atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
               ::load(&this->inited_,memory_order_acquire);
  if ((__pointer_type)init_value.size == (__pointer_type)0x0) {
    pcVar1 = (this->field_0).init_value_.ptr;
    pcVar2 = (char *)(this->field_0).init_value_.size;
    pcStack_28 = pcVar1;
    init_value.ptr = pcVar2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,pcVar1,(ulong)pcVar2,&local_29);
    init_value.size = (size_t)this;
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    std::
    atomic<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::store(&this->inited_,(__pointer_type)init_value.size,memory_order_release);
  }
  WrappedMutex::Unlock(&Init::mu);
  return (string *)init_value.size;
}

Assistant:

const std::string& LazyString::Init() const {
  static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
  mu.Lock();
  const std::string* res = inited_.load(std::memory_order_acquire);
  if (res == nullptr) {
    auto init_value = init_value_;
    res = ::new (static_cast<void*>(string_buf_))
        std::string(init_value.ptr, init_value.size);
    inited_.store(res, std::memory_order_release);
  }
  mu.Unlock();
  return *res;
}